

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O0

void __thiscall kj::_::Once::runOnce(Once *this,Initializer *init)

{
  int iVar1;
  Type *func;
  Fault local_78;
  Fault f;
  bool *local_50;
  Once *local_48;
  undefined1 local_40 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_c__:228:7)>
  _kjDefer235;
  UnwindDetector _kjUnwindDetector235;
  int local_1c;
  uint state;
  Initializer *init_local;
  Once *this_local;
  
  do {
    LOCK();
    local_1c = *(int *)this;
    _kjDefer235._23_1_ = local_1c == 0;
    if ((bool)_kjDefer235._23_1_) {
      *(undefined4 *)this = 1;
      local_1c = 0;
    }
    UNLOCK();
    if ((bool)_kjDefer235._23_1_) {
      UnwindDetector::UnwindDetector((UnwindDetector *)&_kjDefer235.canceled);
      local_50 = &_kjDefer235.canceled;
      local_48 = this;
      defer<kj::_::Once::runOnce(kj::_::Once::Initializer&)::__0>
                ((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_c__:228:7)>
                  *)local_40,(kj *)&local_50,func);
      (*(code *)**(undefined8 **)init)();
      Deferred<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex.c++:228:7)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_c__:228:7)>
                   *)local_40);
      LOCK();
      iVar1 = *(int *)this;
      *(undefined4 *)this = 3;
      UNLOCK();
      if (iVar1 == 2) {
        syscall(0xca,this,0x81,0x7fffffff,0,0,0);
      }
      return;
    }
LAB_0061a9ba:
    do {
      if (local_1c == 3) {
        return;
      }
      if (local_1c == 1) {
        LOCK();
        iVar1 = *(int *)this;
        f.exception._7_1_ = iVar1 == 1;
        if ((bool)f.exception._7_1_) {
          *(undefined4 *)this = 2;
          iVar1 = local_1c;
        }
        UNLOCK();
        local_1c = iVar1;
        if (!(bool)f.exception._7_1_) goto LAB_0061a9ba;
      }
      else if (local_1c != 2) {
        Debug::Fault::Fault(&local_78,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex.c++"
                            ,0x100,FAILED,"state == INITIALIZING_WITH_WAITERS","");
        Debug::Fault::fatal(&local_78);
      }
      syscall(0xca,this,0x80,2,0,0,0);
      local_1c = *(int *)this;
    } while (*(int *)this != 0);
  } while( true );
}

Assistant:

void Once::runOnce(Initializer& init) {
startOver:
  uint state = UNINITIALIZED;
  if (__atomic_compare_exchange_n(&futex, &state, INITIALIZING, false,
                                  __ATOMIC_RELAXED, __ATOMIC_RELAXED)) {
    // It's our job to initialize!
    {
      KJ_ON_SCOPE_FAILURE({
        // An exception was thrown by the initializer.  We have to revert.
        if (__atomic_exchange_n(&futex, UNINITIALIZED, __ATOMIC_RELEASE) ==
            INITIALIZING_WITH_WAITERS) {
          // Someone was waiting for us to finish.
          syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, NULL, NULL, 0);
        }
      });

      init.run();
    }
    if (__atomic_exchange_n(&futex, INITIALIZED, __ATOMIC_RELEASE) ==
        INITIALIZING_WITH_WAITERS) {
      // Someone was waiting for us to finish.
      syscall(SYS_futex, &futex, FUTEX_WAKE_PRIVATE, INT_MAX, NULL, NULL, 0);
    }
  } else {
    for (;;) {
      if (state == INITIALIZED) {
        break;
      } else if (state == INITIALIZING) {
        // Initialization is taking place in another thread.  Indicate that we're waiting.
        if (!__atomic_compare_exchange_n(&futex, &state, INITIALIZING_WITH_WAITERS, true,
                                         __ATOMIC_ACQUIRE, __ATOMIC_ACQUIRE)) {
          // State changed, retry.
          continue;
        }
      } else {
        KJ_DASSERT(state == INITIALIZING_WITH_WAITERS);
      }

      // Wait for initialization.
      syscall(SYS_futex, &futex, FUTEX_WAIT_PRIVATE, INITIALIZING_WITH_WAITERS, NULL, NULL, 0);
      state = __atomic_load_n(&futex, __ATOMIC_ACQUIRE);

      if (state == UNINITIALIZED) {
        // Oh hey, apparently whoever was trying to initialize gave up.  Let's take it from the
        // top.
        goto startOver;
      }
    }
  }
}